

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  ushort uVar1;
  RawSchema *pRVar2;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  InterfaceSchema IVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __n;
  uint uVar9;
  uint64_t id;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  Reader RVar14;
  Maybe<capnp::InterfaceSchema::Method> *result;
  Reader superclass;
  Reader superclasses;
  Schema local_f8;
  Schema local_f0;
  undefined1 local_e8 [20];
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  StructDataBitCount SStack_c8;
  ushort uStack_c4;
  undefined2 uStack_c2;
  int iStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  short sStack_b4;
  undefined2 uStack_b2;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  StructReader local_98;
  MethodList local_68;
  
  uVar7 = name.content.size_;
  uVar9 = *counter;
  *counter = uVar9 + 1;
  if (uVar9 < 0x40) {
    pRVar2 = ((this->super_Schema).raw)->generic;
    getMethods(&local_68,this);
    uVar9 = pRVar2->memberCount;
    if (uVar9 != 0) {
      uVar11 = 0;
      do {
        IVar4.super_Schema.raw = local_68.parent.super_Schema.raw;
        uVar1 = *(ushort *)((long)pRVar2->membersByName + (ulong)(uVar9 + uVar11 & 0xfffffffe));
        _::ListReader::getStructElement
                  ((StructReader *)(local_e8 + 0x10),&local_68.list.reader,(uint)uVar1);
        local_e8._0_8_ = IVar4.super_Schema.raw;
        local_98.data = (void *)CONCAT44(uStack_bc,iStack_c0);
        local_98.pointers._0_4_ = local_b0;
        if (sStack_b4 == 0) {
          local_98.data = (void *)0x0;
          local_98.pointers._0_4_ = 0x7fffffff;
        }
        local_98.segment._0_4_ = 0;
        local_98.segment._4_4_ = 0;
        local_98.capTable._0_4_ = 0;
        local_98.capTable._4_4_ = 0;
        if (sStack_b4 != 0) {
          local_98.segment._0_4_ = local_e8._16_4_;
          local_98.segment._4_4_ = uStack_d4;
          local_98.capTable._0_4_ = uStack_d0;
          local_98.capTable._4_4_ = uStack_cc;
        }
        local_e8._8_2_ = uVar1;
        RVar14 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_98,(void *)0x0,0);
        uVar8 = RVar14.super_StringPtr.content.size_;
        if ((uVar8 == uVar7) &&
           (iVar6 = bcmp(RVar14.super_StringPtr.content.ptr,name.content.ptr,uVar7 - 1), iVar6 == 0)
           ) {
          (__return_storage_ptr__->ptr).isSet = true;
          *(undefined8 *)&(__return_storage_ptr__->ptr).field_1 = local_e8._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(local_e8._12_4_,CONCAT22(local_e8._10_2_,local_e8._8_2_));
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
               (SegmentReader *)CONCAT44(uStack_d4,local_e8._16_4_);
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
               (CapTableReader *)CONCAT44(uStack_cc,uStack_d0);
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
               (void *)CONCAT26(uStack_c2,CONCAT24(uStack_c4,SStack_c8));
          (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
               (WirePointer *)CONCAT44(uStack_bc,iStack_c0);
          pNVar3 = &__return_storage_ptr__->ptr;
          *(undefined4 *)((long)&pNVar3->field_1 + 0x30) = uStack_b8;
          *(short *)((long)&pNVar3->field_1 + 0x34) = sStack_b4;
          *(undefined2 *)((long)&pNVar3->field_1 + 0x36) = uStack_b2;
          *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
               CONCAT44(uStack_ac,local_b0);
          return __return_storage_ptr__;
        }
        uVar10 = uVar9 + uVar11 >> 1;
        __n = uVar7;
        if (uVar8 < uVar7) {
          __n = uVar8;
        }
        iVar6 = memcmp(RVar14.super_StringPtr.content.ptr,name.content.ptr,__n);
        if (iVar6 < 0) {
          uVar11 = uVar10 + 1;
          uVar10 = uVar9;
        }
        else if (uVar8 < uVar7 && iVar6 == 0) {
          uVar11 = uVar10 + 1;
          uVar10 = uVar9;
        }
        uVar9 = uVar10;
      } while (uVar11 < uVar9);
    }
    (__return_storage_ptr__->ptr).isSet = false;
    local_68.list.reader.capTable =
         (CapTableReader *)((this->super_Schema).raw)->generic->encodedNode;
    local_68.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    local_68.list.reader.segment = (SegmentReader *)0x0;
    local_68.list.reader.ptr._0_4_ = 0x7fffffff;
    _::PointerReader::getStruct((StructReader *)local_e8,(PointerReader *)&local_68,(word *)0x0);
    local_98.data = (void *)(CONCAT44(uStack_cc,uStack_d0) + 0x20);
    if (uStack_c4 < 5) {
      local_98.capTable._0_4_ = 0;
      local_98.segment._0_4_ = 0;
      local_98.segment._4_4_ = 0;
      local_98.capTable._4_4_ = 0;
      local_98.pointers._0_4_ = 0x7fffffff;
      local_98.data = (uint64_t *)0x0;
    }
    else {
      local_98.capTable._0_4_ = CONCAT22(local_e8._10_2_,local_e8._8_2_);
      local_98.segment._0_4_ = local_e8._0_4_;
      local_98.segment._4_4_ = local_e8._4_4_;
      local_98.capTable._4_4_ = local_e8._12_4_;
      local_98.pointers._0_4_ = iStack_c0;
    }
    _::PointerReader::getList
              ((ListReader *)&local_68,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0);
    uVar7 = (ulong)(uint)local_68.list.reader.ptr;
    if (uVar7 != 0) {
      lVar12 = 0;
      do {
        _::ListReader::getStructElement(&local_98,(ListReader *)&local_68,(ElementCount)lVar12);
        if (local_98.dataSize < 0x40) {
          id = 0;
        }
        else {
          id = *local_98.data;
        }
        local_f8 = Schema::getDependency(&this->super_Schema,id,(ElementCount)lVar12 | 0x4000000);
        local_f0.raw = (RawBrandedSchema *)Schema::asInterface(&local_f8);
        findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)local_e8,
                         (InterfaceSchema *)&local_f0,name,counter);
        bVar5 = (__return_storage_ptr__->ptr).isSet;
        if ((StructReader *)local_e8 != (StructReader *)__return_storage_ptr__) {
          if ((bVar5 & 1) != 0) {
            (__return_storage_ptr__->ptr).isSet = false;
            bVar5 = 0;
          }
          if (local_e8[0] == '\x01') {
            pNVar3 = &__return_storage_ptr__->ptr;
            *(undefined4 *)((long)&pNVar3->field_1 + 0x30) = local_b0;
            *(short *)((long)&pNVar3->field_1 + 0x34) = (short)uStack_ac;
            *(short *)((long)&pNVar3->field_1 + 0x36) = (short)((uint)uStack_ac >> 0x10);
            *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
                 uStack_a8;
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
                 (void *)CONCAT44(uStack_bc,iStack_c0);
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
                 (WirePointer *)CONCAT26(uStack_b2,CONCAT24(sStack_b4,uStack_b8));
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
                 (SegmentReader *)CONCAT44(uStack_cc,uStack_d0);
            (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
                 (CapTableReader *)CONCAT26(uStack_c2,CONCAT24(uStack_c4,SStack_c8));
            (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
                 (RawBrandedSchema *)
                 CONCAT44(local_e8._12_4_,CONCAT22(local_e8._10_2_,local_e8._8_2_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 CONCAT44(uStack_d4,local_e8._16_4_);
            (__return_storage_ptr__->ptr).isSet = true;
            return __return_storage_ptr__;
          }
        }
        if ((bVar5 & 1) != 0) {
          return __return_storage_ptr__;
        }
        bVar13 = uVar7 - 1 != lVar12;
        lVar12 = lVar12 + 1;
      } while (bVar13);
      return __return_storage_ptr__;
    }
  }
  else {
    findMethodByName();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == nullptr) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != nullptr) {
        break;
      }
    }
  }

  return result;
}